

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O0

void icu_63::initNumberFormatService(void)

{
  ICULocaleService *this;
  code *size;
  ICULocaleService *local_28;
  
  size = numfmt_cleanup;
  ucln_i18n_registerCleanup_63(UCLN_I18N_NUMFMT,numfmt_cleanup);
  this = (ICULocaleService *)UMemory::operator_new((UMemory *)0x198,(size_t)size);
  local_28 = (ICULocaleService *)0x0;
  if (this != (ICULocaleService *)0x0) {
    ICUNumberFormatService::ICUNumberFormatService((ICUNumberFormatService *)this);
    local_28 = this;
  }
  gService = local_28;
  return;
}

Assistant:

static void U_CALLCONV initNumberFormatService() {
    U_ASSERT(gService == NULL);
    ucln_i18n_registerCleanup(UCLN_I18N_NUMFMT, numfmt_cleanup);
    gService = new ICUNumberFormatService();
}